

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::ObjectIntersector1<true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  AABBNodeMB4D *node1;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  RTCIntersectFunctionN p_Var16;
  ulong uVar17;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  int iVar24;
  ulong uVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 extraout_var [56];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  float fVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar39 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  int mask_1;
  ulong local_1370;
  ulong local_1368;
  ulong local_1360;
  ulong local_1358;
  ulong local_1350;
  ulong local_1348;
  NodeRef *local_1340;
  RayQueryContext *local_1338;
  Scene *local_1330;
  ulong local_1328;
  RTCIntersectFunctionNArguments local_1320;
  Geometry *local_12f0;
  undefined8 local_12e8;
  RTCIntersectArguments *local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar3 = ray->tfar;
    if (0.0 <= fVar3) {
      local_1340 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar6 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar5 = (ray->dir).field_0;
      auVar27._8_4_ = 0x7fffffff;
      auVar27._0_8_ = 0x7fffffff7fffffff;
      auVar27._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx((undefined1  [16])aVar5,auVar27);
      auVar43._8_4_ = 0x219392ef;
      auVar43._0_8_ = 0x219392ef219392ef;
      auVar43._12_4_ = 0x219392ef;
      auVar27 = vcmpps_avx(auVar27,auVar43,1);
      auVar27 = vblendvps_avx((undefined1  [16])aVar5,auVar43,auVar27);
      auVar43 = vrcpps_avx(auVar27);
      fVar36 = auVar43._0_4_;
      auVar31._0_4_ = fVar36 * auVar27._0_4_;
      fVar40 = auVar43._4_4_;
      auVar31._4_4_ = fVar40 * auVar27._4_4_;
      fVar41 = auVar43._8_4_;
      auVar31._8_4_ = fVar41 * auVar27._8_4_;
      fVar42 = auVar43._12_4_;
      auVar31._12_4_ = fVar42 * auVar27._12_4_;
      auVar44._8_4_ = 0x3f800000;
      auVar44._0_8_ = &DAT_3f8000003f800000;
      auVar44._12_4_ = 0x3f800000;
      auVar27 = vsubps_avx(auVar44,auVar31);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar4;
      local_11f8._0_4_ = uVar4;
      local_11f8._8_4_ = uVar4;
      local_11f8._12_4_ = uVar4;
      local_11f8._16_4_ = uVar4;
      local_11f8._20_4_ = uVar4;
      local_11f8._24_4_ = uVar4;
      local_11f8._28_4_ = uVar4;
      auVar48 = ZEXT3264(local_11f8);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar4;
      local_1218._0_4_ = uVar4;
      local_1218._8_4_ = uVar4;
      local_1218._12_4_ = uVar4;
      local_1218._16_4_ = uVar4;
      local_1218._20_4_ = uVar4;
      local_1218._24_4_ = uVar4;
      local_1218._28_4_ = uVar4;
      auVar49 = ZEXT3264(local_1218);
      auVar32._0_4_ = fVar36 + fVar36 * auVar27._0_4_;
      auVar32._4_4_ = fVar40 + fVar40 * auVar27._4_4_;
      auVar32._8_4_ = fVar41 + fVar41 * auVar27._8_4_;
      auVar32._12_4_ = fVar42 + fVar42 * auVar27._12_4_;
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar4;
      local_1238._0_4_ = uVar4;
      local_1238._8_4_ = uVar4;
      local_1238._12_4_ = uVar4;
      local_1238._16_4_ = uVar4;
      local_1238._20_4_ = uVar4;
      local_1238._24_4_ = uVar4;
      local_1238._28_4_ = uVar4;
      auVar50 = ZEXT3264(local_1238);
      auVar27 = vshufps_avx(auVar32,auVar32,0);
      local_1258._16_16_ = auVar27;
      local_1258._0_16_ = auVar27;
      auVar51 = ZEXT3264(local_1258);
      auVar27 = vmovshdup_avx(auVar32);
      auVar39 = ZEXT1664(auVar27);
      auVar43 = vshufps_avx(auVar32,auVar32,0x55);
      local_1278._16_16_ = auVar43;
      local_1278._0_16_ = auVar43;
      auVar52 = ZEXT3264(local_1278);
      auVar43 = vshufpd_avx(auVar32,auVar32,1);
      auVar46 = ZEXT1664(auVar43);
      auVar31 = vshufps_avx(auVar32,auVar32,0xaa);
      auVar35 = ZEXT1664(auVar31);
      uVar19 = (ulong)(auVar32._0_4_ < 0.0) << 5;
      uVar20 = (ulong)(auVar27._0_4_ < 0.0) << 5 | 0x40;
      local_1298._16_16_ = auVar31;
      local_1298._0_16_ = auVar31;
      auVar47 = ZEXT3264(local_1298);
      uVar21 = (ulong)(auVar43._0_4_ < 0.0) << 5 | 0x80;
      uVar22 = uVar19 ^ 0x20;
      uVar25 = uVar20 ^ 0x20;
      uVar18 = uVar21 ^ 0x20;
      auVar27 = vshufps_avx(auVar6,auVar6,0);
      auVar30 = ZEXT1664(auVar27);
      local_12b8._16_16_ = auVar27;
      local_12b8._0_16_ = auVar27;
      auVar53 = ZEXT3264(local_12b8);
      auVar27 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      local_12d8._16_16_ = auVar27;
      local_12d8._0_16_ = auVar27;
      auVar54 = ZEXT3264(local_12d8);
      local_1370 = uVar18;
      local_1368 = uVar25;
      local_1360 = uVar22;
      local_1358 = uVar21;
      local_1350 = uVar20;
      local_1348 = uVar19;
      local_1338 = context;
      do {
        if (local_1340 == stack) {
          return;
        }
        sVar23 = local_1340[-1].ptr;
        local_1340 = local_1340 + -1;
        do {
          if ((sVar23 & 8) == 0) {
            uVar13 = sVar23 & 0xfffffffffffffff0;
            fVar3 = (ray->dir).field_0.m128[3];
            auVar28._4_4_ = fVar3;
            auVar28._0_4_ = fVar3;
            auVar28._8_4_ = fVar3;
            auVar28._12_4_ = fVar3;
            auVar28._16_4_ = fVar3;
            auVar28._20_4_ = fVar3;
            auVar28._24_4_ = fVar3;
            auVar28._28_4_ = fVar3;
            pfVar2 = (float *)(uVar13 + 0x100 + uVar19);
            pfVar1 = (float *)(uVar13 + 0x40 + uVar19);
            auVar29._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar29._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar29._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar29._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar29._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar29._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar29._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar29._28_4_ = auVar30._28_4_ + pfVar1[7];
            auVar29 = vsubps_avx(auVar29,auVar48._0_32_);
            auVar7._4_4_ = auVar51._4_4_ * auVar29._4_4_;
            auVar7._0_4_ = auVar51._0_4_ * auVar29._0_4_;
            auVar7._8_4_ = auVar51._8_4_ * auVar29._8_4_;
            auVar7._12_4_ = auVar51._12_4_ * auVar29._12_4_;
            auVar7._16_4_ = auVar51._16_4_ * auVar29._16_4_;
            auVar7._20_4_ = auVar51._20_4_ * auVar29._20_4_;
            auVar7._24_4_ = auVar51._24_4_ * auVar29._24_4_;
            auVar7._28_4_ = auVar29._28_4_;
            pfVar2 = (float *)(uVar13 + 0x100 + uVar20);
            pfVar1 = (float *)(uVar13 + 0x40 + uVar20);
            auVar33._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar33._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar33._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar33._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar33._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar33._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar33._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar33._28_4_ = auVar35._28_4_ + pfVar1[7];
            auVar29 = vmaxps_avx(auVar53._0_32_,auVar7);
            auVar7 = vsubps_avx(auVar33,auVar49._0_32_);
            pfVar2 = (float *)(uVar13 + 0x100 + uVar21);
            auVar8._4_4_ = auVar52._4_4_ * auVar7._4_4_;
            auVar8._0_4_ = auVar52._0_4_ * auVar7._0_4_;
            auVar8._8_4_ = auVar52._8_4_ * auVar7._8_4_;
            auVar8._12_4_ = auVar52._12_4_ * auVar7._12_4_;
            auVar8._16_4_ = auVar52._16_4_ * auVar7._16_4_;
            auVar8._20_4_ = auVar52._20_4_ * auVar7._20_4_;
            auVar8._24_4_ = auVar52._24_4_ * auVar7._24_4_;
            auVar8._28_4_ = auVar7._28_4_;
            pfVar1 = (float *)(uVar13 + 0x40 + uVar21);
            auVar37._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar37._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar37._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar37._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar37._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar37._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar37._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar37._28_4_ = auVar39._28_4_ + pfVar1[7];
            auVar7 = vsubps_avx(auVar37,auVar50._0_32_);
            auVar9._4_4_ = auVar47._4_4_ * auVar7._4_4_;
            auVar9._0_4_ = auVar47._0_4_ * auVar7._0_4_;
            auVar9._8_4_ = auVar47._8_4_ * auVar7._8_4_;
            auVar9._12_4_ = auVar47._12_4_ * auVar7._12_4_;
            auVar9._16_4_ = auVar47._16_4_ * auVar7._16_4_;
            auVar9._20_4_ = auVar47._20_4_ * auVar7._20_4_;
            fVar36 = auVar7._28_4_;
            auVar9._24_4_ = auVar47._24_4_ * auVar7._24_4_;
            auVar9._28_4_ = fVar36;
            auVar7 = vmaxps_avx(auVar8,auVar9);
            pfVar2 = (float *)(uVar13 + 0x100 + uVar22);
            auVar29 = vmaxps_avx(auVar29,auVar7);
            pfVar1 = (float *)(uVar13 + 0x40 + uVar22);
            auVar34._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar34._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar34._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar34._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar34._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar34._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar34._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar34._28_4_ = fVar36 + pfVar1[7];
            auVar7 = vsubps_avx(auVar34,auVar48._0_32_);
            auVar10._4_4_ = auVar51._4_4_ * auVar7._4_4_;
            auVar10._0_4_ = auVar51._0_4_ * auVar7._0_4_;
            auVar10._8_4_ = auVar51._8_4_ * auVar7._8_4_;
            auVar10._12_4_ = auVar51._12_4_ * auVar7._12_4_;
            auVar10._16_4_ = auVar51._16_4_ * auVar7._16_4_;
            auVar10._20_4_ = auVar51._20_4_ * auVar7._20_4_;
            auVar10._24_4_ = auVar51._24_4_ * auVar7._24_4_;
            auVar10._28_4_ = auVar7._28_4_;
            auVar7 = vminps_avx(auVar54._0_32_,auVar10);
            pfVar2 = (float *)(uVar13 + 0x100 + uVar25);
            pfVar1 = (float *)(uVar13 + 0x40 + uVar25);
            auVar38._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar38._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar38._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar38._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar38._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar38._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar38._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar38._28_4_ = fVar36 + pfVar1[7];
            auVar8 = vsubps_avx(auVar38,auVar49._0_32_);
            auVar11._4_4_ = auVar52._4_4_ * auVar8._4_4_;
            auVar11._0_4_ = auVar52._0_4_ * auVar8._0_4_;
            auVar11._8_4_ = auVar52._8_4_ * auVar8._8_4_;
            auVar11._12_4_ = auVar52._12_4_ * auVar8._12_4_;
            auVar11._16_4_ = auVar52._16_4_ * auVar8._16_4_;
            auVar11._20_4_ = auVar52._20_4_ * auVar8._20_4_;
            auVar11._24_4_ = auVar52._24_4_ * auVar8._24_4_;
            auVar11._28_4_ = auVar8._28_4_;
            pfVar2 = (float *)(uVar13 + 0x100 + uVar18);
            pfVar1 = (float *)(uVar13 + 0x40 + uVar18);
            auVar45._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar45._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar45._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar45._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar45._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar45._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar45._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar45._28_4_ = auVar46._28_4_ + pfVar1[7];
            auVar8 = vsubps_avx(auVar45,auVar50._0_32_);
            auVar12._4_4_ = auVar47._4_4_ * auVar8._4_4_;
            auVar12._0_4_ = auVar47._0_4_ * auVar8._0_4_;
            auVar12._8_4_ = auVar47._8_4_ * auVar8._8_4_;
            auVar12._12_4_ = auVar47._12_4_ * auVar8._12_4_;
            auVar12._16_4_ = auVar47._16_4_ * auVar8._16_4_;
            auVar12._20_4_ = auVar47._20_4_ * auVar8._20_4_;
            auVar12._24_4_ = auVar47._24_4_ * auVar8._24_4_;
            auVar12._28_4_ = auVar8._28_4_;
            auVar46 = ZEXT3264(auVar12);
            auVar8 = vminps_avx(auVar11,auVar12);
            auVar39 = ZEXT3264(auVar8);
            auVar7 = vminps_avx(auVar7,auVar8);
            auVar29 = vcmpps_avx(auVar29,auVar7,2);
            auVar30 = ZEXT3264(auVar29);
            if (((uint)sVar23 & 7) == 6) {
              auVar7 = vcmpps_avx(*(undefined1 (*) [32])(uVar13 + 0x1c0),auVar28,2);
              auVar8 = vcmpps_avx(auVar28,*(undefined1 (*) [32])(uVar13 + 0x1e0),1);
              auVar8 = vandps_avx(auVar7,auVar8);
              auVar29 = vandps_avx(auVar8,auVar29);
              auVar30 = ZEXT1664(auVar29._16_16_);
              auVar27 = vpackssdw_avx(auVar29._0_16_,auVar29._16_16_);
            }
            else {
              auVar27 = vpackssdw_avx(auVar29._0_16_,auVar29._16_16_);
            }
            auVar35 = ZEXT3264(auVar7);
            auVar27 = vpsllw_avx(auVar27,0xf);
            auVar27 = vpacksswb_avx(auVar27,auVar27);
            unaff_RBX = (ulong)(byte)(SUB161(auVar27 >> 7,0) & 1 |
                                      (SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                      (SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                      (SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                      (SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                      (SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                      (SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                     SUB161(auVar27 >> 0x3f,0) << 7);
          }
          if ((sVar23 & 8) == 0) {
            if (unaff_RBX == 0) {
              iVar24 = 4;
            }
            else {
              uVar13 = sVar23 & 0xfffffffffffffff0;
              lVar15 = 0;
              if (unaff_RBX != 0) {
                for (; (unaff_RBX >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                }
              }
              iVar24 = 0;
              sVar23 = *(size_t *)(uVar13 + lVar15 * 8);
              uVar17 = unaff_RBX - 1 & unaff_RBX;
              if (uVar17 != 0) {
                local_1340->ptr = sVar23;
                lVar15 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                  }
                }
                uVar14 = uVar17 - 1;
                while( true ) {
                  local_1340 = local_1340 + 1;
                  sVar23 = *(size_t *)(uVar13 + lVar15 * 8);
                  uVar14 = uVar14 & uVar17;
                  if (uVar14 == 0) break;
                  local_1340->ptr = sVar23;
                  lVar15 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                    }
                  }
                  uVar17 = uVar14 - 1;
                }
              }
            }
          }
          else {
            iVar24 = 6;
          }
        } while (iVar24 == 0);
        if (iVar24 == 6) {
          iVar24 = 0;
          local_1328 = (ulong)((uint)sVar23 & 0xf) - 8;
          bVar26 = local_1328 != 0;
          if (bVar26) {
            local_1330 = local_1338->scene;
            uVar13 = 0;
            do {
              local_1320.geomID = *(uint *)((sVar23 & 0xfffffffffffffff0) + uVar13 * 8);
              local_12f0 = (local_1330->geometries).items[local_1320.geomID].ptr;
              if ((ray->mask & local_12f0->mask) != 0) {
                local_1320.primID = *(uint *)((sVar23 & 0xfffffffffffffff0) + 4 + uVar13 * 8);
                mask_1 = -1;
                local_1320.valid = &mask_1;
                local_1320.geometryUserPtr = local_12f0->userPtr;
                local_1320.context = local_1338->user;
                local_1320.N = 1;
                local_12e8 = 0;
                local_12e0 = local_1338->args;
                p_Var16 = local_12e0->intersect;
                if (p_Var16 == (RTCIntersectFunctionN)0x0) {
                  p_Var16 = (RTCIntersectFunctionN)
                            local_12f0[1].super_RefCount.refCounter.
                            super___atomic_base<unsigned_long>._M_i;
                }
                auVar35 = ZEXT1664(auVar35._0_16_);
                auVar39 = ZEXT1664(auVar39._0_16_);
                auVar46 = ZEXT1664(auVar46._0_16_);
                local_1320.rayhit = (RTCRayHitN *)ray;
                (*p_Var16)(&local_1320);
                auVar30._8_56_ = extraout_var;
                auVar30._0_8_ = extraout_XMM1_Qa;
                auVar48 = ZEXT3264(local_11f8);
                auVar49 = ZEXT3264(local_1218);
                auVar50 = ZEXT3264(local_1238);
                auVar51 = ZEXT3264(local_1258);
                auVar52 = ZEXT3264(local_1278);
                auVar47 = ZEXT3264(local_1298);
                auVar53 = ZEXT3264(local_12b8);
                auVar54 = ZEXT3264(local_12d8);
                if (ray->tfar < 0.0) {
                  uVar18 = local_1370;
                  uVar19 = local_1348;
                  uVar20 = local_1350;
                  uVar21 = local_1358;
                  uVar22 = local_1360;
                  uVar25 = local_1368;
                  if (bVar26) {
                    ray->tfar = -INFINITY;
                    iVar24 = 3;
                  }
                  break;
                }
              }
              uVar13 = uVar13 + 1;
              bVar26 = uVar13 < local_1328;
              uVar18 = local_1370;
              uVar19 = local_1348;
              uVar20 = local_1350;
              uVar21 = local_1358;
              uVar22 = local_1360;
              uVar25 = local_1368;
            } while (uVar13 != local_1328);
          }
        }
      } while (iVar24 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }